

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O1

ActionResults * __thiscall WhiteRoomOneAction::Touch(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *this_01;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  itemType local_84;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == DISCUS) {
    local_84 = DISCUS;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_84);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 == BACKPACK) {
      this_01 = (ActionResults *)operator_new(0x30);
      paVar4 = &local_40.field_2;
      local_40._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"It\'s slick, like butter. It\'s also shiny, as in reflective."
                 ,"");
      ActionResults::ActionResults(this_01,CURRENT,&local_40);
      _Var3._M_p = local_40._M_dataplus._M_p;
      goto LAB_0011fdaf;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  this_01 = (ActionResults *)operator_new(0x30);
  if (iVar1 == LIGHT) {
    paVar4 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "You wave your hand aimlessly in the air. Good thing no one is watching.","");
    ActionResults::ActionResults(this_01,CURRENT,&local_60);
    _Var3._M_p = local_60._M_dataplus._M_p;
  }
  else {
    paVar4 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"That was touching, but ineffective.","");
    ActionResults::ActionResults(this_01,CURRENT,&local_80);
    _Var3._M_p = local_80._M_dataplus._M_p;
  }
LAB_0011fdaf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  return this_01;
}

Assistant:

ActionResults * WhiteRoomOneAction::Touch() {
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK) {
        return new ActionResults(CURRENT, "It's slick, like butter. It's also shiny, as in reflective.");
    }
    else if(commands->getMainItem() == LIGHT){
        return new ActionResults(CURRENT, "You wave your hand aimlessly in the air. Good thing no one is watching.");
    }
    else {
        return new ActionResults(CURRENT, "That was touching, but ineffective.");
    }
}